

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall
TypeOpFloatLess::TypeOpFloatLess(TypeOpFloatLess *this,TypeFactory *t,Translate *trans)

{
  OpBehaviorFloatLess *this_00;
  allocator local_41;
  string local_40 [32];
  Translate *local_20;
  Translate *trans_local;
  TypeFactory *t_local;
  TypeOpFloatLess *this_local;
  
  local_20 = trans;
  trans_local = (Translate *)t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"<",&local_41);
  TypeOpBinary::TypeOpBinary
            (&this->super_TypeOpBinary,t,CPUI_FLOAT_LESS,(string *)local_40,TYPE_BOOL,TYPE_FLOAT);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084ca00;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x50080;
  this_00 = (OpBehaviorFloatLess *)operator_new(0x18);
  OpBehaviorFloatLess::OpBehaviorFloatLess(this_00,local_20);
  (this->super_TypeOpBinary).super_TypeOp.behave = (OpBehavior *)this_00;
  return;
}

Assistant:

TypeOpFloatLess::TypeOpFloatLess(TypeFactory *t,const Translate *trans)
  : TypeOpBinary(t,CPUI_FLOAT_LESS,"<",TYPE_BOOL,TYPE_FLOAT)
{
  opflags = PcodeOp::binary | PcodeOp::booloutput | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatLess(trans);
}